

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O0

int http_SendMessage(SOCKINFO *info,int *TimeOut,char *fmt,...)

{
  char in_AL;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  undefined8 in_RCX;
  FILE *pFVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  size_t *local_248;
  undefined8 *local_230;
  char *local_1c0;
  undefined8 *local_1b8;
  long *local_1a0;
  undefined1 local_188 [24];
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  uint local_cc;
  char *pcStack_c8;
  int rc;
  char *str;
  size_t n;
  int nr;
  int I_fmt_processed;
  size_t num_written;
  size_t buf_length;
  uint local_98;
  int RetVal;
  int nw;
  char c;
  char *buf;
  va_list argp;
  size_t Data_Buf_Size;
  off_t amount_to_be_read;
  size_t num_read;
  char Chunk_Header [10];
  char *ChunkBuf;
  char *file_buf;
  char *filename;
  SendInstruction *Instr;
  FILE *Fp;
  char *fmt_local;
  int *TimeOut_local;
  SOCKINFO *info_local;
  
  if (in_AL != '\0') {
    local_158 = in_XMM0_Qa;
    local_148 = in_XMM1_Qa;
    local_138 = in_XMM2_Qa;
    local_128 = in_XMM3_Qa;
    local_118 = in_XMM4_Qa;
    local_108 = in_XMM5_Qa;
    local_f8 = in_XMM6_Qa;
    local_e8 = in_XMM7_Qa;
  }
  filename = (char *)0x0;
  ChunkBuf = (char *)0x0;
  Chunk_Header[2] = '\0';
  Chunk_Header[3] = '\0';
  Chunk_Header[4] = '\0';
  Chunk_Header[5] = '\0';
  Chunk_Header[6] = '\0';
  Chunk_Header[7] = '\0';
  Chunk_Header[8] = '\0';
  Chunk_Header[9] = '\0';
  Data_Buf_Size = 0;
  argp[0].reg_save_area = &Elf64_Ehdr_00100000;
  _nw = (char *)0x0;
  buf_length._4_4_ = 0;
  n._4_4_ = 0;
  local_170 = in_RCX;
  local_168 = in_R8;
  local_160 = in_R9;
  memset((void *)((long)&num_read + 6),0,10);
  argp[0].overflow_arg_area = local_188;
  argp[0]._0_8_ = &stack0x00000008;
  buf._4_4_ = 0x30;
  buf._0_4_ = 0x18;
  Fp = (FILE *)fmt;
  do {
    do {
      do {
        while( true ) {
          pFVar5 = (FILE *)((long)&Fp->_flags + 1);
          RetVal._3_1_ = (char)Fp->_flags;
          if (RetVal._3_1_ == '\0') goto LAB_0011378c;
          Fp = pFVar5;
          if ((RetVal._3_1_ != 'I') || (n._4_4_ != 0)) break;
          n._4_4_ = 1;
          if ((uint)buf < 0x29) {
            local_1a0 = (long *)((long)(int)(uint)buf + (long)argp[0].overflow_arg_area);
            buf._0_4_ = (uint)buf + 8;
          }
          else {
            local_1a0 = (long *)argp[0]._0_8_;
            argp[0]._0_8_ = argp[0]._0_8_ + 8;
          }
          filename = (char *)*local_1a0;
          if (*(long *)(filename + 0x1a8) < 0) {
            Data_Buf_Size = (size_t)argp[0].reg_save_area;
          }
          else {
            Data_Buf_Size = *(size_t *)(filename + 0x1a8);
          }
          if ((long)Data_Buf_Size < 0x100000) {
            argp[0].reg_save_area = (void *)Data_Buf_Size;
          }
          Chunk_Header._2_8_ = malloc((long)argp[0].reg_save_area + 0x14);
          if ((void *)Chunk_Header._2_8_ == (void *)0x0) {
            buf_length._4_4_ = -0x68;
            goto LAB_0011378c;
          }
          ChunkBuf = (char *)(Chunk_Header._2_8_ + 10);
        }
        if (RetVal._3_1_ == 'f') {
          if ((uint)buf < 0x29) {
            local_1b8 = (undefined8 *)((long)(int)(uint)buf + (long)argp[0].overflow_arg_area);
            buf._0_4_ = (uint)buf + 8;
          }
          else {
            local_1b8 = (undefined8 *)argp[0]._0_8_;
            argp[0]._0_8_ = argp[0]._0_8_ + 8;
          }
          if ((filename == (char *)0x0) || (*(int *)filename == 0)) {
            Instr = (SendInstruction *)fopen((char *)*local_1b8,"rb");
          }
          else {
            Instr = (SendInstruction *)
                    (*virtualDirCallback.open)
                              ((char *)*local_1b8,UPNP_READ,*(void **)(filename + 0x1c0),
                               *(void **)(filename + 0x1c8));
          }
          if (Instr == (SendInstruction *)0x0) {
            buf_length._4_4_ = -0x1f7;
            goto LAB_0011378c;
          }
          if (((filename == (char *)0x0) || (*(int *)(filename + 8) == 0)) ||
             (*(int *)filename == 0)) {
            if (((filename == (char *)0x0) || (*(int *)(filename + 8) == 0)) ||
               (iVar1 = fseeko((FILE *)Instr,*(__off_t *)(filename + 0x1a0),1), iVar1 == 0))
            goto LAB_00113216;
            buf_length._4_4_ = -0x1f7;
          }
          else {
            iVar1 = (*virtualDirCallback.seek)
                              (Instr,*(off_t *)(filename + 0x1a0),1,*(void **)(filename + 0x1c0),
                               *(void **)(filename + 0x1c8));
            if (iVar1 == 0) goto LAB_00113216;
            buf_length._4_4_ = -0x1f7;
          }
          goto LAB_001135aa;
        }
      } while (RetVal._3_1_ != 'b');
      if ((uint)buf < 0x29) {
        local_230 = (undefined8 *)((long)(int)(uint)buf + (long)argp[0].overflow_arg_area);
        buf._0_4_ = (uint)buf + 8;
      }
      else {
        local_230 = (undefined8 *)argp[0]._0_8_;
        argp[0]._0_8_ = argp[0]._0_8_ + 8;
      }
      _nw = (char *)*local_230;
      if ((uint)buf < 0x29) {
        local_248 = (size_t *)((long)(int)(uint)buf + (long)argp[0].overflow_arg_area);
        buf._0_4_ = (uint)buf + 8;
      }
      else {
        local_248 = (size_t *)argp[0]._0_8_;
        argp[0]._0_8_ = argp[0]._0_8_ + 8;
      }
      num_written = *local_248;
    } while (num_written == 0);
    local_98 = sock_write(info,_nw,num_written,TimeOut);
    _nr = (size_t)(int)local_98;
    UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x2c4,
               ">>> (SENT) >>>\n%.*s\nbuf_length=%zd, num_written=%zd\n------------\n",
               num_written & 0xffffffff,_nw,num_written,_nr);
  } while (_nr == num_written);
  buf_length._4_4_ = 0;
LAB_0011378c:
  free((void *)Chunk_Header._2_8_);
  return buf_length._4_4_;
LAB_00113216:
  if (Data_Buf_Size == 0) goto LAB_001135aa;
  if (filename == (char *)0x0) {
    amount_to_be_read = fread(ChunkBuf,1,(size_t)argp[0].reg_save_area,(FILE *)Instr);
  }
  else {
    if ((long)Data_Buf_Size < (long)argp[0].reg_save_area) {
      local_1c0 = (char *)Data_Buf_Size;
    }
    else {
      local_1c0 = (char *)argp[0].reg_save_area;
    }
    str = local_1c0;
    if (*(int *)filename == 0) {
      amount_to_be_read = fread(ChunkBuf,1,(size_t)local_1c0,(FILE *)Instr);
    }
    else {
      n._0_4_ = (*virtualDirCallback.read)
                          (Instr,ChunkBuf,(size_t)local_1c0,*(void **)(filename + 0x1c0),
                           *(void **)(filename + 0x1c8));
      amount_to_be_read = (off_t)(int)n;
    }
    Data_Buf_Size = Data_Buf_Size - amount_to_be_read;
    if (*(long *)(filename + 0x1a8) < 0) {
      Data_Buf_Size = (size_t)argp[0].reg_save_area;
    }
  }
  if (amount_to_be_read == 0) {
    if ((filename == (char *)0x0) || (*(int *)(filename + 4) == 0)) {
      buf_length._4_4_ = -0x1f7;
    }
    else {
      pcStack_c8 = "0\r\n\r\n";
      sVar2 = strlen("0\r\n\r\n");
      local_98 = sock_write(info,"0\r\n\r\n",sVar2,TimeOut);
    }
    goto LAB_001135aa;
  }
  if ((filename == (char *)0x0) || (*(int *)(filename + 4) == 0)) {
    local_98 = sock_write(info,ChunkBuf,amount_to_be_read,TimeOut);
    UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x2a1,
               ">>> (SENT) >>>\n%.*s\n------------\n",(ulong)local_98,ChunkBuf);
    _nr = (size_t)(int)local_98;
    if (((int)local_98 < 1) || (_nr != amount_to_be_read)) goto LAB_001135aa;
  }
  else {
    (ChunkBuf + amount_to_be_read)[0] = '\r';
    (ChunkBuf + amount_to_be_read)[1] = '\n';
    memset((void *)((long)&num_read + 6),0,10);
    local_cc = snprintf((char *)((long)&num_read + 6),10,"%zx\r\n");
    if (((int)local_cc < 0) || (9 < local_cc)) {
      buf_length._4_4_ = -0x38f;
      goto LAB_001135aa;
    }
    sVar2 = strlen((char *)((long)&num_read + 6));
    sVar3 = strlen((char *)((long)&num_read + 6));
    memcpy(ChunkBuf + -sVar2,(void *)((long)&num_read + 6),sVar3);
    sVar2 = strlen((char *)((long)&num_read + 6));
    sVar3 = strlen((char *)((long)&num_read + 6));
    local_98 = sock_write(info,ChunkBuf + -sVar2,amount_to_be_read + sVar3 + 2,TimeOut);
    sVar4 = (size_t)(int)local_98;
    _nr = sVar4;
    if (((int)local_98 < 1) ||
       (sVar2 = strlen((char *)((long)&num_read + 6)), sVar4 != amount_to_be_read + sVar2 + 2))
    goto LAB_001135aa;
  }
  goto LAB_00113216;
LAB_001135aa:
  if ((filename == (char *)0x0) || (*(int *)filename == 0)) {
    fclose((FILE *)Instr);
  }
  else {
    (*virtualDirCallback.close)(Instr,*(void **)(filename + 0x1c0),*(void **)(filename + 0x1c8));
  }
  goto LAB_0011378c;
}

Assistant:

int http_SendMessage(SOCKINFO *info, int *TimeOut, const char *fmt, ...)
{
#if EXCLUDE_WEB_SERVER == 0
	FILE *Fp;
	struct SendInstruction *Instr = NULL;
	char *filename = NULL;
	char *file_buf = NULL;
	char *ChunkBuf = NULL;
	/* 10 byte allocated for chunk header. */
	char Chunk_Header[CHUNK_HEADER_SIZE];
	size_t num_read;
	off_t amount_to_be_read = 0;
	size_t Data_Buf_Size = WEB_SERVER_BUF_SIZE;
#endif /* EXCLUDE_WEB_SERVER */
	va_list argp;
	char *buf = NULL;
	char c;
	int nw;
	int RetVal = 0;
	size_t buf_length;
	size_t num_written;
	int I_fmt_processed = 0;

#if EXCLUDE_WEB_SERVER == 0
	memset(Chunk_Header, 0, sizeof(Chunk_Header));
#endif /* EXCLUDE_WEB_SERVER */
	va_start(argp, fmt);
	while ((c = *fmt++)) {
#if EXCLUDE_WEB_SERVER == 0
		if (c == 'I' && !I_fmt_processed) {
			I_fmt_processed = 1;
			Instr = va_arg(argp, struct SendInstruction *);
			if (Instr->ReadSendSize >= 0)
				amount_to_be_read = Instr->ReadSendSize;
			else
				amount_to_be_read = (off_t)Data_Buf_Size;
			if (amount_to_be_read < (off_t)WEB_SERVER_BUF_SIZE)
				Data_Buf_Size = (size_t)amount_to_be_read;
			ChunkBuf = malloc(
				(size_t)(Data_Buf_Size + CHUNK_HEADER_SIZE +
					 CHUNK_TAIL_SIZE));
			if (!ChunkBuf) {
				RetVal = UPNP_E_OUTOF_MEMORY;
				goto ExitFunction;
			}
			file_buf = ChunkBuf + CHUNK_HEADER_SIZE;
		} else if (c == 'f') {
			/* file name */
			filename = va_arg(argp, char *);
			if (Instr && Instr->IsVirtualFile)
				Fp = (virtualDirCallback.open)(filename,
					UPNP_READ,
					Instr->Cookie,
					Instr->RequestCookie);
			else
	#ifdef _WIN32
				fopen_s(&Fp, filename, "rb");
	#else
				Fp = fopen(filename, "rb");
	#endif
			if (Fp == NULL) {
				RetVal = UPNP_E_FILE_READ_ERROR;
				goto ExitFunction;
			}
			if (Instr && Instr->IsRangeActive &&
				Instr->IsVirtualFile) {
				if (virtualDirCallback.seek(Fp,
					    Instr->RangeOffset,
					    SEEK_CUR,
					    Instr->Cookie,
					    Instr->RequestCookie) != 0) {
					RetVal = UPNP_E_FILE_READ_ERROR;
					goto Cleanup_File;
				}
			} else if (Instr && Instr->IsRangeActive) {
				if (fseeko(Fp, Instr->RangeOffset, SEEK_CUR) !=
					0) {
					RetVal = UPNP_E_FILE_READ_ERROR;
					goto Cleanup_File;
				}
			}
			while (amount_to_be_read) {
				if (Instr) {
					int nr;
					size_t n =
						amount_to_be_read >=
								(off_t)Data_Buf_Size
							? Data_Buf_Size
							: (size_t)amount_to_be_read;
					if (Instr->IsVirtualFile) {
						nr = virtualDirCallback.read(Fp,
							file_buf,
							n,
							Instr->Cookie,
							Instr->RequestCookie);
						num_read = (size_t)nr;
					} else {
						num_read = fread(file_buf,
							(size_t)1,
							n,
							Fp);
					}
					amount_to_be_read -= (off_t)num_read;
					if (Instr->ReadSendSize < 0) {
						/* read until close */
						amount_to_be_read =
							(off_t)Data_Buf_Size;
					}
				} else {
					num_read = fread(file_buf,
						(size_t)1,
						Data_Buf_Size,
						Fp);
				}
				if (num_read == (size_t)0) {
					/* EOF so no more to send. */
					if (Instr && Instr->IsChunkActive) {
						const char *str = "0\r\n\r\n";
						nw = sock_write(info,
							str,
							strlen(str),
							TimeOut);
					} else {
						RetVal = UPNP_E_FILE_READ_ERROR;
					}
					goto Cleanup_File;
				}
				/* Create chunk for the current buffer. */
				if (Instr && Instr->IsChunkActive) {
					int rc;
					/* Copy CRLF at the end of the chunk */
					memcpy(file_buf + num_read,
						"\r\n",
						(size_t)2);
					/* Hex length for the chunk size. */
					memset(Chunk_Header,
						0,
						sizeof(Chunk_Header));
					rc = snprintf(Chunk_Header,
						sizeof(Chunk_Header),
						"%" PRIzx "\r\n",
						num_read);
					if (rc < 0 ||
						(unsigned int)rc >=
							sizeof(Chunk_Header)) {
						RetVal = UPNP_E_INTERNAL_ERROR;
						goto Cleanup_File;
					}
					/* Copy the chunk size header  */
					memcpy(file_buf - strlen(Chunk_Header),
						Chunk_Header,
						strlen(Chunk_Header));
					/* on the top of the buffer. */
					/*file_buf[num_read+strlen(Chunk_Header)]
					 * = NULL; */
					/*upnpprintf("Sending
					 * %s\n",file_buf-strlen(Chunk_Header));*/
					nw = sock_write(info,
						file_buf - strlen(Chunk_Header),
						num_read +
							strlen(Chunk_Header) +
							(size_t)2,
						TimeOut);
					num_written = (size_t)nw;
					if (nw <= 0 ||
						num_written !=
							num_read +
								strlen(Chunk_Header) +
								(size_t)2)
						/* Send error nothing we can do.
						 */
						goto Cleanup_File;
				} else {
					/* write data */
					nw = sock_write(info,
						file_buf,
						num_read,
						TimeOut);
					UpnpPrintf(UPNP_INFO,
						HTTP,
						__FILE__,
						__LINE__,
						">>> (SENT) "
						">>>\n%.*s\n------------\n",
						nw,
						file_buf);
					/* Send error nothing we can do */
					num_written = (size_t)nw;
					if (nw <= 0 ||
						num_written != num_read) {
						goto Cleanup_File;
					}
				}
			} /* while */
		Cleanup_File:
			if (Instr && Instr->IsVirtualFile) {
				virtualDirCallback.close(Fp,
					Instr->Cookie,
					Instr->RequestCookie);
			} else {
				fclose(Fp);
			}
			goto ExitFunction;
		} else
#endif /* EXCLUDE_WEB_SERVER */
			if (c == 'b') {
				/* memory buffer */
				buf = va_arg(argp, char *);
				buf_length = va_arg(argp, size_t);
				if (buf_length > (size_t)0) {
					nw = sock_write(
						info, buf, buf_length, TimeOut);
					num_written = (size_t)nw;
					UpnpPrintf(UPNP_INFO,
						HTTP,
						__FILE__,
						__LINE__,
						">>> (SENT) >>>\n"
						"%.*s\nbuf_length=%" PRIzd
						", num_written=%" PRIzd "\n"
						"------------\n",
						(int)buf_length,
						buf,
						buf_length,
						num_written);
					if (num_written != buf_length) {
						RetVal = 0;
						goto ExitFunction;
					}
				}
			}
	}

ExitFunction:
	va_end(argp);
#if EXCLUDE_WEB_SERVER == 0
	free(ChunkBuf);
#endif /* EXCLUDE_WEB_SERVER */
	return RetVal;
}